

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn-state-machine.cc
# Opt level: O2

void __thiscall dynet::RNNStateMachine::failure(RNNStateMachine *this,RNNOp op)

{
  ostream *poVar1;
  invalid_argument *this_00;
  string asStack_1b8 [32];
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostream *)&oss,"State transition error: currently in state ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->q_);
  poVar1 = std::operator<<(poVar1," but received operation ");
  std::ostream::operator<<(poVar1,op);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,asStack_1b8);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void RNNStateMachine::failure(RNNOp op) {
  ostringstream oss; oss << "State transition error: currently in state " << q_ << " but received operation " << op;
  throw std::invalid_argument(oss.str());
}